

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O2

void __thiscall
duckdb::SQLLogicTestLogger::ColumnCountMismatch
          (SQLLogicTestLogger *this,MaterializedQueryResult *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *result_values_string,idx_t expected_column_count,bool row_wise)

{
  ostream *poVar1;
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"Wrong column count in query!",&local_51);
  PrintErrorHeader(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Expected ");
  poVar1 = termcolor::bold(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = termcolor::reset(poVar1);
  poVar1 = std::operator<<(poVar1," columns, but got ");
  poVar1 = termcolor::bold(poVar1);
  duckdb::BaseQueryResult::ColumnCount();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = termcolor::reset(poVar1);
  poVar1 = std::operator<<(poVar1," columns");
  std::endl<char,std::char_traits<char>>(poVar1);
  PrintLineSep();
  PrintSQL(this);
  PrintLineSep();
  PrintResultError(this,result,result_values_string,expected_column_count,row_wise);
  return;
}

Assistant:

void SQLLogicTestLogger::ColumnCountMismatch(MaterializedQueryResult &result,
                                             const vector<string> &result_values_string, idx_t expected_column_count,
                                             bool row_wise) {
	PrintErrorHeader("Wrong column count in query!");
	std::cerr << "Expected " << termcolor::bold << expected_column_count << termcolor::reset << " columns, but got "
	          << termcolor::bold << result.ColumnCount() << termcolor::reset << " columns" << std::endl;
	PrintLineSep();
	PrintSQL();
	PrintLineSep();
	PrintResultError(result, result_values_string, expected_column_count, row_wise);
}